

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::multiplicativeInverse(APInt *this,APInt *modulo)

{
  bool bVar1;
  APInt *in_RDX;
  undefined8 extraout_RDX;
  APInt AVar2;
  APInt *local_d0;
  APInt *local_b8;
  APInt local_90;
  uint local_7c;
  undefined1 local_78 [4];
  uint i;
  APInt q;
  APInt t [2];
  APInt r [2];
  APInt *modulo_local;
  APInt *this_local;
  
  bVar1 = ult(modulo,in_RDX);
  if (bVar1) {
    APInt((APInt *)&t[1].BitWidth,in_RDX);
    APInt((APInt *)&r[0].BitWidth,modulo);
    APInt((APInt *)&q.BitWidth,modulo->BitWidth,0,false);
    APInt((APInt *)&t[0].BitWidth,modulo->BitWidth,1,false);
    APInt((APInt *)local_78,modulo->BitWidth,0,false);
    local_7c = 0;
    while (bVar1 = operator!=((APInt *)&t[(ulong)(local_7c ^ 1) + 1].BitWidth,0), bVar1) {
      udivrem((APInt *)&t[(ulong)local_7c + 1].BitWidth,
              (APInt *)&t[(ulong)(local_7c ^ 1) + 1].BitWidth,(APInt *)local_78,
              (APInt *)&t[(ulong)local_7c + 1].BitWidth);
      operator*(&local_90,(APInt *)&t[(ulong)(local_7c ^ 1) - 1].BitWidth);
      operator-=((APInt *)&t[(ulong)local_7c - 1].BitWidth,&local_90);
      ~APInt(&local_90);
      local_7c = local_7c ^ 1;
    }
    bVar1 = operator!=((APInt *)&t[(ulong)local_7c + 1].BitWidth,1);
    if (bVar1) {
      APInt(this,modulo->BitWidth,0,false);
    }
    else {
      bVar1 = isNegative((APInt *)&t[(ulong)local_7c - 1].BitWidth);
      if (bVar1) {
        operator+=((APInt *)&t[(ulong)local_7c - 1].BitWidth,in_RDX);
      }
      APInt(this,(APInt *)&t[(ulong)local_7c - 1].BitWidth);
    }
    ~APInt((APInt *)local_78);
    local_b8 = (APInt *)&t[1].BitWidth;
    do {
      local_b8 = local_b8 + -1;
      ~APInt(local_b8);
    } while (local_b8 != (APInt *)&q.BitWidth);
    local_d0 = (APInt *)&r[1].BitWidth;
    do {
      local_d0 = local_d0 + -1;
      ~APInt(local_d0);
    } while (local_d0 != (APInt *)&t[1].BitWidth);
    AVar2._8_8_ = extraout_RDX;
    AVar2.U.pVal = (uint64_t *)this;
    return AVar2;
  }
  __assert_fail("ult(modulo) && \"This APInt must be smaller than the modulo\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x452,"APInt llvm::APInt::multiplicativeInverse(const APInt &) const");
}

Assistant:

APInt APInt::multiplicativeInverse(const APInt& modulo) const {
  assert(ult(modulo) && "This APInt must be smaller than the modulo");

  // Using the properties listed at the following web page (accessed 06/21/08):
  //   http://www.numbertheory.org/php/euclid.html
  // (especially the properties numbered 3, 4 and 9) it can be proved that
  // BitWidth bits suffice for all the computations in the algorithm implemented
  // below. More precisely, this number of bits suffice if the multiplicative
  // inverse exists, but may not suffice for the general extended Euclidean
  // algorithm.

  APInt r[2] = { modulo, *this };
  APInt t[2] = { APInt(BitWidth, 0), APInt(BitWidth, 1) };
  APInt q(BitWidth, 0);

  unsigned i;
  for (i = 0; r[i^1] != 0; i ^= 1) {
    // An overview of the math without the confusing bit-flipping:
    // q = r[i-2] / r[i-1]
    // r[i] = r[i-2] % r[i-1]
    // t[i] = t[i-2] - t[i-1] * q
    udivrem(r[i], r[i^1], q, r[i]);
    t[i] -= t[i^1] * q;
  }

  // If this APInt and the modulo are not coprime, there is no multiplicative
  // inverse, so return 0. We check this by looking at the next-to-last
  // remainder, which is the gcd(*this,modulo) as calculated by the Euclidean
  // algorithm.
  if (r[i] != 1)
    return APInt(BitWidth, 0);

  // The next-to-last t is the multiplicative inverse.  However, we are
  // interested in a positive inverse. Calculate a positive one from a negative
  // one if necessary. A simple addition of the modulo suffices because
  // abs(t[i]) is known to be less than *this/2 (see the link above).
  if (t[i].isNegative())
    t[i] += modulo;

  return std::move(t[i]);
}